

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

size_t perfetto::
       TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
       ::Get<>(EventContext *ctx,char **value)

{
  InternedDebugAnnotationValueTypeName *pIVar1;
  _Base_ptr iid;
  pair<std::_Rb_tree_iterator<std::pair<const_char_*const,_unsigned_long>_>,_bool> pVar2;
  pair<const_char_*,_unsigned_long> local_28;
  
  pIVar1 = GetOrCreateIndexForField(ctx->incremental_state_);
  iid = (_Base_ptr)
        ((pIVar1->
         super_TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
         ).index_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
  local_28.first = *value;
  local_28.second = (unsigned_long)iid;
  pVar2 = ::std::
          _Rb_tree<char_const*,std::pair<char_const*const,unsigned_long>,std::_Select1st<std::pair<char_const*const,unsigned_long>>,std::less<char_const*>,std::allocator<std::pair<char_const*const,unsigned_long>>>
          ::_M_emplace_unique<std::pair<char_const*,unsigned_long>>
                    ((_Rb_tree<char_const*,std::pair<char_const*const,unsigned_long>,std::_Select1st<std::pair<char_const*const,unsigned_long>>,std::less<char_const*>,std::allocator<std::pair<char_const*const,unsigned_long>>>
                      *)&(pIVar1->
                         super_TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
                         ).index_,&local_28);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iid = pVar2.first._M_node._M_node[1]._M_parent;
  }
  else {
    internal::InternedDebugAnnotationValueTypeName::Add
              (&(ctx->incremental_state_->serialized_interned_data).msg_.super_InternedData,
               (size_t)iid,*value);
  }
  return (size_t)iid;
}

Assistant:

static size_t Get(EventContext* ctx,
                    const ValueType& value,
                    Args&&... add_args) {
    // First check if the value exists in the dictionary.
    auto index_for_field = GetOrCreateIndexForField(ctx->incremental_state_);
    size_t iid;
    if (PERFETTO_LIKELY(index_for_field->index_.LookUpOrInsert(&iid, value))) {
      PERFETTO_DCHECK(iid);
      return iid;
    }

    // If not, we need to serialize the definition of the interned value into
    // the heap buffered message (which is committed to the trace when the
    // packet ends).
    PERFETTO_DCHECK(iid);
    InternedDataType::Add(
        ctx->incremental_state_->serialized_interned_data.get(), iid,
        std::move(value), std::forward<Args>(add_args)...);
    return iid;
  }